

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_seekable_bid(archive_read *a,wchar_t best_bid)

{
  int *p;
  byte bVar1;
  zip *zip;
  wchar_t wVar2;
  wchar_t wVar3;
  size_t sVar4;
  int64_t iVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  size_t min;
  
  wVar2 = L'\xffffffff';
  if (best_bid < L'!') {
    zip = (zip *)a->format->data;
    sVar4 = __archive_read_seek(a,0,2);
    wVar2 = L'\0';
    if (0 < (long)sVar4) {
      min = 0x4000;
      if ((long)sVar4 < 0x4000) {
        min = sVar4;
      }
      iVar9 = (int)min;
      iVar5 = __archive_read_seek(a,(long)-iVar9,2);
      wVar2 = L'\0';
      if (-1 < iVar5) {
        wVar2 = L'\0';
        pvVar6 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (0x16 < iVar9 && pvVar6 != (void *)0x0) {
          uVar7 = iVar9 - 0x16;
          do {
            uVar8 = (ulong)uVar7;
            bVar1 = *(byte *)((long)pvVar6 + uVar8);
            if (bVar1 < 0x4b) {
              if (bVar1 == 5) {
                iVar9 = -2;
              }
              else if (bVar1 == 6) {
                iVar9 = -3;
              }
              else {
LAB_0015e508:
                iVar9 = -4;
              }
            }
            else if (bVar1 == 0x4b) {
              iVar9 = -1;
            }
            else {
              if (bVar1 != 0x50) goto LAB_0015e508;
              p = (int *)((long)pvVar6 + uVar8);
              iVar9 = -4;
              if (*p == 0x6054b50) {
                wVar2 = read_eocd(zip,(char *)p,iVar5 + uVar8);
                if ((int)uVar7 < 0x14) {
                  return wVar2;
                }
                if (p[-5] != 0x7064b50) {
                  return wVar2;
                }
                wVar3 = read_zip64_eocd(a,zip,(char *)(p + -5));
                if ((uint)wVar2 < (uint)wVar3) {
                  return wVar3;
                }
                return wVar2;
              }
            }
            bVar10 = SCARRY4(uVar7,iVar9);
            uVar7 = uVar7 + iVar9;
          } while (uVar7 != 0 && bVar10 == (int)uVar7 < 0);
        }
      }
    }
  }
  return wVar2;
}

Assistant:

static int
archive_read_format_zip_seekable_bid(struct archive_read *a, int best_bid)
{
	struct zip *zip = (struct zip *)a->format->data;
	int64_t file_size, current_offset;
	const char *p;
	int i, tail;

	/* If someone has already bid more than 32, then avoid
	   trashing the look-ahead buffers with a seek. */
	if (best_bid > 32)
		return (-1);

	file_size = __archive_read_seek(a, 0, SEEK_END);
	if (file_size <= 0)
		return 0;

	/* Search last 16k of file for end-of-central-directory
	 * record (which starts with PK\005\006) */
	tail = (int)zipmin(1024 * 16, file_size);
	current_offset = __archive_read_seek(a, -tail, SEEK_END);
	if (current_offset < 0)
		return 0;
	if ((p = __archive_read_ahead(a, (size_t)tail, NULL)) == NULL)
		return 0;
	/* Boyer-Moore search backwards from the end, since we want
	 * to match the last EOCD in the file (there can be more than
	 * one if there is an uncompressed Zip archive as a member
	 * within this Zip archive). */
	for (i = tail - 22; i > 0;) {
		switch (p[i]) {
		case 'P':
			if (memcmp(p + i, "PK\005\006", 4) == 0) {
				int ret = read_eocd(zip, p + i,
				    current_offset + i);
				/* Zip64 EOCD locator precedes
				 * regular EOCD if present. */
				if (i >= 20 && memcmp(p + i - 20, "PK\006\007", 4) == 0) {
					int ret_zip64 = read_zip64_eocd(a, zip, p + i - 20);
					if (ret_zip64 > ret)
						ret = ret_zip64;
				}
				return (ret);
			}
			i -= 4;
			break;
		case 'K': i -= 1; break;
		case 005: i -= 2; break;
		case 006: i -= 3; break;
		default: i -= 4; break;
		}
	}
	return 0;
}